

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O3

string * Assimp::FBX::Util::AddLineAndColumn
                   (string *__return_storage_ptr__,string *prefix,string *text,uint line,uint column
                   )

{
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_1a8,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8," (line ",7);
  std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8," <<  col ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)aoStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,") ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_1a8,(text->_M_dataplus)._M_p,text->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string AddLineAndColumn(const std::string& prefix, const std::string& text, unsigned int line, unsigned int column)
{
    return static_cast<std::string>( (Formatter::format() << prefix << " (line " << line << " <<  col " << column << ") " << text) );
}